

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_compaction_test.cc
# Opt level: O0

void multi_writers(char *test_name)

{
  timeval b;
  timeval a;
  timeval b_00;
  timeval a_00;
  fdb_status fVar1;
  long lVar2;
  fdb_file_handle *in_stack_ffffffffffffe908;
  fdb_file_handle *in_stack_ffffffffffffe910;
  pthread_t apStack_16b8 [8];
  long alStack_1678 [3];
  undefined1 auStack_1660 [248];
  undefined8 auStack_1568 [2];
  char acStack_1558 [8];
  char acStack_1550 [120];
  fdb_config *in_stack_ffffffffffffeb28;
  char *in_stack_ffffffffffffeb30;
  fdb_file_handle **in_stack_ffffffffffffeb38;
  char acStack_1450 [16];
  undefined1 auStack_1440 [4032];
  undefined8 local_480;
  undefined4 local_478 [2];
  undefined1 auStack_470 [248];
  void *local_378 [2];
  pthread_t local_368;
  __suseconds_t local_360;
  __time_t local_358;
  __suseconds_t local_350;
  timeval local_340;
  __suseconds_t local_330;
  __time_t local_328;
  __suseconds_t local_320;
  timeval local_310;
  int local_2fc;
  undefined8 uStack_2f8;
  int i_1;
  undefined8 local_2f0;
  undefined8 local_2e8;
  uint local_2dc;
  undefined1 local_2d8 [4];
  int i;
  __time_t local_1e0;
  timeval ts_gap;
  timeval ts_cur;
  timeval ts_begin;
  void **thread_ret;
  compactor_thread_args *cargs;
  void **compactor_ret;
  pthread_t *compactor_tid;
  pthread_t *tid;
  writer_thread_args *wargs;
  fdb_status status;
  int r;
  fdb_config fconfig;
  fdb_file_handle *dbfile;
  int64_t writer_shard_size;
  int num_writers;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  char *test_name_local;
  
  local_480 = 0x1040dc;
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  local_480 = 0x1040e9;
  memleak_start();
  system("rm -rf ./big_file* > errorlog.txt");
  printf("\nLoading %lu docs %d key length %d bodylen. Buffercache %luMB. Target docsize %luMB...",
         0x964fda,200,10,0x14,0x800);
  gettimeofday((timeval *)&ts_cur.tv_usec,(__timezone_ptr_t)0x0);
  fdb_get_default_config();
  memcpy(&status,local_2d8,0xf8);
  fconfig.compactor_sleep_duration._0_1_ = 1;
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0x140;
  fconfig.blocksize = 0;
  fconfig.auto_commit = true;
  fVar1 = fdb_open(in_stack_ffffffffffffeb38,in_stack_ffffffffffffeb30,in_stack_ffffffffffffeb28);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
            ,0xdf);
    multi_writers::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
                    ,0xdf,"void multi_writers(const char *)");
    }
  }
  for (local_2dc = 7; -1 < (int)local_2dc; local_2dc = local_2dc - 1) {
    alStack_1678[(long)(int)local_2dc * 0x48 + 1] = (long)(int)local_2dc * 0x12c9fb;
    alStack_1678[(long)(int)local_2dc * 0x48] = (long)(int)(local_2dc + 1) * 0x12c9fb + -1;
    memcpy(auStack_1660 + (long)(int)local_2dc * 0x240,&status,0xf8);
    fdb_get_default_kvs_config();
    lVar2 = (long)(int)local_2dc;
    auStack_1568[lVar2 * 0x48] = uStack_2f8;
    auStack_1568[lVar2 * 0x48 + 1] = local_2f0;
    *(undefined8 *)(acStack_1550 + lVar2 * 0x240 + -8) = local_2e8;
    *(undefined8 *)(auStack_1660 + (long)(int)local_2dc * 0x240 + -8) = 0x267a;
    auStack_1440[(long)(int)local_2dc * 0x240] = 1;
    sprintf(acStack_1550 + (long)(int)local_2dc * 0x240,"%s_%d.0","./big_file",(ulong)local_2dc);
    sprintf(acStack_1450 + (long)(int)local_2dc * 0x240,"kv_%d",0);
    pthread_create(apStack_16b8 + (int)local_2dc,(pthread_attr_t *)0x0,_writer_thread,
                   alStack_1678 + (long)(int)local_2dc * 0x48);
  }
  local_478[0] = 8;
  memcpy(auStack_470,&status,0xf8);
  pthread_create(&local_368,(pthread_attr_t *)0x0,_compactor_thread,local_478);
  for (local_2fc = 0; local_2fc < 8; local_2fc = local_2fc + 1) {
    pthread_join(apStack_16b8[local_2fc],(void **)(&stack0xffffffffffffe908 + (long)local_2fc * 8));
  }
  local_478[0] = 0;
  pthread_join(local_368,local_378);
  fVar1 = fdb_commit(in_stack_ffffffffffffe908,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
            ,0xfb);
    multi_writers::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
                    ,0xfb,"void multi_writers(const char *)");
    }
  }
  gettimeofday((timeval *)&ts_gap.tv_usec,(__timezone_ptr_t)0x0);
  local_320 = ts_cur.tv_usec;
  local_330 = ts_gap.tv_usec;
  local_328 = ts_cur.tv_sec;
  a_00.tv_usec = ts_begin.tv_sec;
  a_00.tv_sec = ts_cur.tv_usec;
  b_00.tv_usec = ts_cur.tv_sec;
  b_00.tv_sec = ts_gap.tv_usec;
  local_310 = _utime_gap(a_00,b_00);
  local_1e0 = local_310.tv_sec;
  ts_gap.tv_sec = local_310.tv_usec;
  printf("\nFile created %lu docs loaded (keylen %d doclen %d) in%ldsec",0x964fda,200,10,
         local_310.tv_sec);
  printf("\nStarting compaction...");
  printf("\n");
  gettimeofday((timeval *)&ts_cur.tv_usec,(__timezone_ptr_t)0x0);
  wargs._0_4_ = fdb_compact_with_cow(in_stack_ffffffffffffe910,(char *)in_stack_ffffffffffffe908);
  if ((fdb_status)wargs == FDB_RESULT_COMPACTION_FAIL) {
    wargs._0_4_ = fdb_compact(in_stack_ffffffffffffe910,(char *)in_stack_ffffffffffffe908);
  }
  if ((fdb_status)wargs != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
            ,0x10b);
    multi_writers::__test_pass = 0;
    if ((fdb_status)wargs != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
                    ,0x10b,"void multi_writers(const char *)");
    }
  }
  gettimeofday((timeval *)&ts_gap.tv_usec,(__timezone_ptr_t)0x0);
  local_350 = ts_cur.tv_usec;
  local_360 = ts_gap.tv_usec;
  local_358 = ts_cur.tv_sec;
  a.tv_usec = ts_begin.tv_sec;
  a.tv_sec = ts_cur.tv_usec;
  b.tv_usec = ts_cur.tv_sec;
  b.tv_sec = ts_gap.tv_usec;
  local_340 = _utime_gap(a,b);
  local_1e0 = local_340.tv_sec;
  ts_gap.tv_sec = local_340.tv_usec;
  printf("\nCompaction completed in %ld seconds\n",local_340.tv_sec);
  fVar1 = fdb_close(in_stack_ffffffffffffe908);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
            ,0x113);
    multi_writers::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
                    ,0x113,"void multi_writers(const char *)");
    }
  }
  fVar1 = fdb_shutdown();
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
            ,0x117);
    multi_writers::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_compaction_test.cc"
                    ,0x117,"void multi_writers(const char *)");
    }
  }
  memleak_end();
  if (multi_writers::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n",test_name);
  }
  else {
    fprintf(_stderr,"%s PASSED\n",test_name);
  }
  return;
}

Assistant:

void multi_writers(const char *test_name) {
    TEST_INIT();
    memleak_start();

    int num_writers = NUM_WRITERS;
    int64_t writer_shard_size = NUM_DOCS / NUM_WRITERS;
    fdb_file_handle *dbfile;
    fdb_config fconfig;
    int r;
    fdb_status status;
    struct writer_thread_args *wargs = alca(struct writer_thread_args,
                                       num_writers);
    thread_t *tid = alca(thread_t, num_writers);
    thread_t *compactor_tid = alca(thread_t, 1);
    void **compactor_ret = alca(void *, 1);
    struct compactor_thread_args *cargs = alca(struct compactor_thread_args, 1);
    void **thread_ret = alca(void *, num_writers);
    struct timeval ts_begin, ts_cur, ts_gap;

    // remove previous test files
    r = system(SHELL_DEL TEST_FILENAME "* > errorlog.txt");
    (void) r;

    printf("\nLoading %" _F64 " docs %d key length %d bodylen."
           " Buffercache %" _F64 "MB. Target docsize %" _F64 "MB...",
            NUM_DOCS, MAX_KEY_LEN, BODY_LEN,
            BUFFERCACHE_SIZE ? (uint64_t)BUFFERCACHE_SIZE/ (1024 * 1024) : 0,
            (uint64_t)(MAX_KEY_LEN + BODY_LEN + 8) * NUM_DOCS / (1024 * 1024));
    gettimeofday(&ts_begin, NULL);

    fconfig = fdb_get_default_config();
    fconfig.multi_kv_instances = MULTI_KV;
    fconfig.buffercache_size = BUFFERCACHE_SIZE;
    fconfig.durability_opt = FDB_DRB_ODIRECT;
    status = fdb_open(&dbfile, TEST_FILENAME, &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    for (int i = num_writers - 1; i >= 0; --i) {
        // Writer Thread Config:
        wargs[i].docid_low = i*writer_shard_size;
        wargs[i].docid_high = ((i + 1) * writer_shard_size) - 1;
        wargs[i].config = fconfig;
        wargs[i].kvs_config = fdb_get_default_kvs_config();
        wargs[i].batch_size = NUM_DOCS / 1000;
        wargs[i].commit_opt = FDB_COMMIT_MANUAL_WAL_FLUSH;
        sprintf(wargs[i].test_file_name, "%s_%d.0", TEST_FILENAME, i);
        sprintf(wargs[i].kv_store_name, "kv_%d", 0);

        thread_create(&tid[i], _writer_thread, &wargs[i]);
    }

    cargs->num_files = num_writers;
    cargs->config = fconfig;
    thread_create(compactor_tid, _compactor_thread, cargs);

    // wait for thread termination
    for (int i = 0; i < num_writers; ++i) {
        thread_join(tid[i], &thread_ret[i]);
    }
    cargs->num_files = 0; // ask compactor to stop
    thread_join(*compactor_tid, compactor_ret);

    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    gettimeofday(&ts_cur, NULL);
    ts_gap = _utime_gap(ts_begin, ts_cur);

    printf("\nFile created %" _F64 " docs loaded (keylen %d doclen %d) in"
           "%ldsec", NUM_DOCS, MAX_KEY_LEN, BODY_LEN, ts_gap.tv_sec);

    printf("\nStarting compaction...");
    printf("\n"); // flush stdio buffer
    gettimeofday(&ts_begin, NULL);

    status = fdb_compact_with_cow(dbfile, TEST_FILENAME "2");
    if (status == FDB_RESULT_COMPACTION_FAIL) {
        status = fdb_compact(dbfile, TEST_FILENAME "2");
    }
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    gettimeofday(&ts_cur, NULL);
    ts_gap = _utime_gap(ts_begin, ts_cur);

    printf("\nCompaction completed in %ld seconds\n", ts_gap.tv_sec);

    status = fdb_close(dbfile);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // shutdown
    status = fdb_shutdown();
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    memleak_end();
    TEST_RESULT(test_name);
}